

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  char cVar1;
  int iVar2;
  IConfig *pIVar3;
  ulong uVar4;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&s,(string *)value);
  pIVar3 = getGlobalConfig();
  if ((pIVar3 != (IConfig *)0x0) &&
     (iVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(pIVar3),
     (char)iVar2 != '\0')) {
    for (uVar4 = 0; uVar4 < s._M_string_length; uVar4 = uVar4 + 1) {
      subs._M_dataplus._M_p = (pointer)&subs.field_2;
      subs._M_string_length = 0;
      subs.field_2._M_local_buf[0] = '\0';
      cVar1 = s._M_dataplus._M_p[uVar4];
      if ((((cVar1 == '\t') || (cVar1 == '\n')) || (cVar1 == '\r')) &&
         (std::__cxx11::string::assign((char *)&subs), subs._M_string_length != 0)) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&s);
        std::operator+(&local_70,&local_b0,&subs);
        uVar4 = uVar4 + 1;
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&s);
        std::operator+(&local_50,&local_70,&local_90);
        std::__cxx11::string::operator=((string *)&s,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&subs);
    }
  }
  std::operator+(&subs,"\"",&s);
  std::operator+(__return_storage_ptr__,&subs,"\"");
  std::__cxx11::string::~string((string *)&subs);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    IConfig const* config = getGlobalConfig();
    if( config && config->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\r': subs = "\\r"; break;
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}